

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::FreeColSingletonPS::execute
          (FreeColSingletonPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  uint *puVar1;
  int iVar2;
  pointer pnVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  type_conflict5 tVar5;
  bool bVar6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *b;
  long lVar7;
  int k;
  long lVar8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  z;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  cpp_dec_float<50U,_int,_void> local_288;
  cpp_dec_float<50U,_int,_void> local_250;
  cpp_dec_float<50U,_int,_void> local_218;
  cpp_dec_float<50U,_int,_void> local_1d8;
  cpp_dec_float<50U,_int,_void> local_198;
  cpp_dec_float<50U,_int,_void> local_160;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  int local_80;
  undefined1 local_7c;
  undefined8 local_78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  if (this->m_i != this->m_old_i) {
    pnVar3 = (s->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&pnVar3[this->m_old_i].m_backend,&pnVar3[this->m_i].m_backend);
    pnVar3 = (y->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&pnVar3[this->m_old_i].m_backend,&pnVar3[this->m_i].m_backend);
    rStatus->data[this->m_old_i] = rStatus->data[this->m_i];
  }
  b = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
       *)(long)this->m_j;
  if (this->m_j != this->m_old_j) {
    pnVar3 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&pnVar3[this->m_old_j].m_backend,&pnVar3[(long)b].m_backend);
    pnVar3 = (r->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&pnVar3[this->m_old_j].m_backend,&pnVar3[this->m_j].m_backend);
    b = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
         *)cStatus->data;
    (b->m_backend).data._M_elems[this->m_old_j] = (b->m_backend).data._M_elems[this->m_j];
  }
  lVar7 = 0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_250,0.0,(type *)0x0);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_160,
               &(this->m_row).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,this->m_j);
  for (lVar8 = 0;
      lVar8 < (this->m_row).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused; lVar8 = lVar8 + 1) {
    pNVar4 = (this->m_row).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .m_elem;
    iVar2 = *(int *)((long)(&pNVar4->val + 1) + lVar7);
    if (iVar2 != this->m_j) {
      local_288.fpclass = cpp_dec_float_finite;
      local_288.prec_elem = 10;
      local_288.data._M_elems[0] = 0;
      local_288.data._M_elems[1] = 0;
      local_288.data._M_elems[2] = 0;
      local_288.data._M_elems[3] = 0;
      local_288.data._M_elems[4] = 0;
      local_288.data._M_elems[5] = 0;
      local_288.data._M_elems._24_5_ = 0;
      local_288.data._M_elems[7]._1_3_ = 0;
      local_288.data._M_elems._32_5_ = 0;
      local_288._37_8_ = 0;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_288,
                 (cpp_dec_float<50U,_int,_void> *)
                 ((long)(pNVar4->val).m_backend.data._M_elems + lVar7),
                 &(x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar2].m_backend);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (&local_250,&local_288);
    }
    lVar7 = lVar7 + 0x3c;
  }
  local_a8 = *(undefined8 *)(this->m_lRhs).m_backend.data._M_elems;
  uStack_a0 = *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 2);
  local_98 = *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 4);
  uStack_90 = *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 6);
  local_88 = *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 8);
  local_80 = (this->m_lRhs).m_backend.exp;
  local_7c = (this->m_lRhs).m_backend.neg;
  local_78._0_4_ = (this->m_lRhs).m_backend.fpclass;
  local_78._4_4_ = (this->m_lRhs).m_backend.prec_elem;
  local_e8.m_backend.data._M_elems[0] = local_250.data._M_elems[0];
  local_e8.m_backend.data._M_elems[1] = local_250.data._M_elems[1];
  local_e8.m_backend.data._M_elems[2] = local_250.data._M_elems[2];
  local_e8.m_backend.data._M_elems[3] = local_250.data._M_elems[3];
  local_e8.m_backend.data._M_elems[4] = local_250.data._M_elems[4];
  local_e8.m_backend.data._M_elems[5] = local_250.data._M_elems[5];
  local_e8.m_backend.data._M_elems[6] = local_250.data._M_elems[6];
  local_e8.m_backend.data._M_elems[7] = local_250.data._M_elems[7];
  local_e8.m_backend.data._M_elems[8] = local_250.data._M_elems[8];
  local_e8.m_backend.data._M_elems[9] = local_250.data._M_elems[9];
  local_e8.m_backend.exp = local_250.exp;
  local_e8.m_backend.neg = local_250.neg;
  local_e8.m_backend.fpclass = local_250.fpclass;
  local_e8.m_backend.prec_elem = local_250.prec_elem;
  maxAbs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&local_288,(soplex *)&local_a8,&local_e8,b);
  local_218.data._M_elems[0] = 0;
  local_218.data._M_elems[1] = 0x3ff00000;
  tVar5 = boost::multiprecision::operator<
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_288,(double *)&local_218);
  if (tVar5) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_288,1.0);
  }
  local_1d8.fpclass = cpp_dec_float_finite;
  local_1d8.prec_elem = 10;
  local_1d8.data._M_elems[0] = 0;
  local_1d8.data._M_elems[1] = 0;
  local_1d8.data._M_elems[2] = 0;
  local_1d8.data._M_elems[3] = 0;
  local_1d8.data._M_elems[4] = 0;
  local_1d8.data._M_elems[5] = 0;
  local_1d8.data._M_elems._24_5_ = 0;
  local_1d8.data._M_elems[7]._1_3_ = 0;
  local_1d8.data._M_elems._32_5_ = 0;
  local_1d8.data._M_elems[9]._1_3_ = 0;
  local_1d8.exp = 0;
  local_1d8.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_1d8,&(this->m_lRhs).m_backend,&local_288);
  local_198.fpclass = cpp_dec_float_finite;
  local_198.prec_elem = 10;
  local_198.data._M_elems[0] = 0;
  local_198.data._M_elems[1] = 0;
  local_198.data._M_elems[2] = 0;
  local_198.data._M_elems[3] = 0;
  local_198.data._M_elems[4] = 0;
  local_198.data._M_elems[5] = 0;
  local_198.data._M_elems._24_5_ = 0;
  local_198.data._M_elems[7]._1_3_ = 0;
  local_198.data._M_elems._32_5_ = 0;
  local_198._37_8_ = 0;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_198,&local_250,&local_288);
  local_218.fpclass = cpp_dec_float_finite;
  local_218.prec_elem = 10;
  local_218.data._M_elems[0] = 0;
  local_218.data._M_elems[1] = 0;
  local_218.data._M_elems[2] = 0;
  local_218.data._M_elems[3] = 0;
  local_218.data._M_elems[4] = 0;
  local_218.data._M_elems[5] = 0;
  local_218.data._M_elems[6] = 0;
  local_218.data._M_elems[7] = 0;
  local_218.data._M_elems._32_5_ = 0;
  local_218.data._M_elems[9]._1_3_ = 0;
  local_218.exp = 0;
  local_218.neg = false;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_218,&local_1d8,&local_198);
  local_128.m_backend.data._M_elems[0] = local_218.data._M_elems[0];
  local_128.m_backend.data._M_elems[1] = local_218.data._M_elems[1];
  local_128.m_backend.data._M_elems[2] = local_218.data._M_elems[2];
  local_128.m_backend.data._M_elems[3] = local_218.data._M_elems[3];
  local_128.m_backend.data._M_elems[4] = local_218.data._M_elems[4];
  local_128.m_backend.data._M_elems[5] = local_218.data._M_elems[5];
  local_128.m_backend.data._M_elems[6] = local_218.data._M_elems[6];
  local_128.m_backend.data._M_elems[7] = local_218.data._M_elems[7];
  local_128.m_backend.data._M_elems[9]._1_3_ = local_218.data._M_elems[9]._1_3_;
  local_128.m_backend.data._M_elems._32_5_ = local_218.data._M_elems._32_5_;
  local_128.m_backend.exp = local_218.exp;
  local_128.m_backend.neg = local_218.neg;
  local_128.m_backend.fpclass = local_218.fpclass;
  local_128.m_backend.prec_elem = local_218.prec_elem;
  (*(this->super_PostStep)._vptr_PostStep[7])(&local_68,this);
  bVar6 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_128,&local_68);
  if (bVar6) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_218,0.0);
  }
  local_198.fpclass = cpp_dec_float_finite;
  local_198.prec_elem = 10;
  local_198.data._M_elems[0] = 0;
  local_198.data._M_elems[1] = 0;
  local_198.data._M_elems[2] = 0;
  local_198.data._M_elems[3] = 0;
  local_198.data._M_elems[4] = 0;
  local_198.data._M_elems[5] = 0;
  local_198.data._M_elems._24_5_ = 0;
  local_198.data._M_elems[7]._1_3_ = 0;
  local_198.data._M_elems._32_5_ = 0;
  local_198._37_8_ = 0;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_198,&local_218,&local_288);
  local_1d8.fpclass = cpp_dec_float_finite;
  local_1d8.prec_elem = 10;
  local_1d8.data._M_elems[0] = 0;
  local_1d8.data._M_elems[1] = 0;
  local_1d8.data._M_elems[2] = 0;
  local_1d8.data._M_elems[3] = 0;
  local_1d8.data._M_elems[4] = 0;
  local_1d8.data._M_elems[5] = 0;
  local_1d8.data._M_elems._24_5_ = 0;
  local_1d8.data._M_elems[7]._1_3_ = 0;
  local_1d8.data._M_elems._32_5_ = 0;
  local_1d8.data._M_elems[9]._1_3_ = 0;
  local_1d8.exp = 0;
  local_1d8.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_1d8,&local_198,&local_160);
  iVar2 = this->m_j;
  pnVar3 = (x->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(ulong *)(pnVar3[iVar2].m_backend.data._M_elems + 8) =
       CONCAT35(local_1d8.data._M_elems[9]._1_3_,local_1d8.data._M_elems._32_5_);
  puVar1 = pnVar3[iVar2].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = local_1d8.data._M_elems._16_8_;
  *(ulong *)(puVar1 + 2) = CONCAT35(local_1d8.data._M_elems[7]._1_3_,local_1d8.data._M_elems._24_5_)
  ;
  *(undefined8 *)&pnVar3[iVar2].m_backend.data = local_1d8.data._M_elems._0_8_;
  *(undefined8 *)(pnVar3[iVar2].m_backend.data._M_elems + 2) = local_1d8.data._M_elems._8_8_;
  pnVar3[iVar2].m_backend.exp = local_1d8.exp;
  pnVar3[iVar2].m_backend.neg = local_1d8.neg;
  pnVar3[iVar2].m_backend.fpclass = local_1d8.fpclass;
  pnVar3[iVar2].m_backend.prec_elem = local_1d8.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
            (&(s->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[this->m_i].m_backend,
             &(this->m_lRhs).m_backend);
  local_1d8.fpclass = cpp_dec_float_finite;
  local_1d8.prec_elem = 10;
  local_1d8.data._M_elems[0] = 0;
  local_1d8.data._M_elems[1] = 0;
  local_1d8.data._M_elems[2] = 0;
  local_1d8.data._M_elems[3] = 0;
  local_1d8.data._M_elems[4] = 0;
  local_1d8.data._M_elems[5] = 0;
  local_1d8.data._M_elems._24_5_ = 0;
  local_1d8.data._M_elems[7]._1_3_ = 0;
  local_1d8.data._M_elems._32_5_ = 0;
  local_1d8.data._M_elems[9]._1_3_ = 0;
  local_1d8.exp = 0;
  local_1d8.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_1d8,&(this->m_obj).m_backend,&local_160);
  iVar2 = this->m_i;
  pnVar3 = (y->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(ulong *)(pnVar3[iVar2].m_backend.data._M_elems + 8) =
       CONCAT35(local_1d8.data._M_elems[9]._1_3_,local_1d8.data._M_elems._32_5_);
  puVar1 = pnVar3[iVar2].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = local_1d8.data._M_elems._16_8_;
  *(ulong *)(puVar1 + 2) = CONCAT35(local_1d8.data._M_elems[7]._1_3_,local_1d8.data._M_elems._24_5_)
  ;
  *(undefined8 *)&pnVar3[iVar2].m_backend.data = local_1d8.data._M_elems._0_8_;
  *(undefined8 *)(pnVar3[iVar2].m_backend.data._M_elems + 2) = local_1d8.data._M_elems._8_8_;
  pnVar3[iVar2].m_backend.exp = local_1d8.exp;
  pnVar3[iVar2].m_backend.neg = local_1d8.neg;
  pnVar3[iVar2].m_backend.fpclass = local_1d8.fpclass;
  pnVar3[iVar2].m_backend.prec_elem = local_1d8.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)
             ((r->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + this->m_j),0.0);
  cStatus->data[this->m_j] = BASIC;
  if (this->m_eqCons == true) {
    rStatus->data[this->m_i] = FIXED;
  }
  else if (this->m_onLhs == true) {
    rStatus->data[this->m_i] = ON_LOWER;
  }
  else {
    rStatus->data[this->m_i] = ON_UPPER;
  }
  return;
}

Assistant:

void SPxMainSM<R>::FreeColSingletonPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{

   // correcting the change of idx by deletion of the row:
   if(m_i != m_old_i)
   {
      s[m_old_i] = s[m_i];
      y[m_old_i] = y[m_i];
      rStatus[m_old_i] = rStatus[m_i];
   }

   // correcting the change of idx by deletion of the column:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   // primal:
   R val = 0.0;
   R aij = m_row[m_j];

   for(int k = 0; k < m_row.size(); ++k)
   {
      if(m_row.index(k) != m_j)
         val += m_row.value(k) * x[m_row.index(k)];
   }

   R scale = maxAbs(m_lRhs, val);

   if(scale < 1.0)
      scale = 1.0;

   R z = (m_lRhs / scale) - (val / scale);

   if(isZero(z, this->epsilon()))
      z = 0.0;

   x[m_j] = z * scale / aij;
   s[m_i] = m_lRhs;

   // dual:
   y[m_i] = m_obj / aij;
   r[m_j] = 0.0;

   // basis:
   cStatus[m_j] = SPxSolverBase<R>::BASIC;

   if(m_eqCons)
      rStatus[m_i] = SPxSolverBase<R>::FIXED;
   else if(m_onLhs)
      rStatus[m_i] = SPxSolverBase<R>::ON_LOWER;
   else
      rStatus[m_i] = SPxSolverBase<R>::ON_UPPER;

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM22 Dimension doesn't match after this step.");
   }

#endif
}